

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O1

void duckdb::AggregateStateCombine(DataChunk *input,ExpressionState *state_p,Vector *result)

{
  ArenaAllocator *this;
  PhysicalType PVar1;
  _func_int **__n;
  undefined8 uVar2;
  BoundFunctionExpression *pBVar3;
  pointer pFVar4;
  reference pvVar5;
  IOException *pIVar6;
  idx_t len;
  idx_t iVar7;
  data_ptr_t pdVar8;
  uint *puVar9;
  Vector *pVVar10;
  idx_t idx;
  uint *puVar11;
  anon_union_16_2_67f50693_for_value aVar12;
  string_t sVar13;
  AggregateInputData aggr_input_data;
  UnifiedVectorFormat state0_data;
  UnifiedVectorFormat state1_data;
  string local_120;
  undefined1 local_100 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  UnifiedVectorFormat local_b8;
  string local_70;
  string local_50;
  
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                     (&state_p->expr->super_BaseExpression);
  pFVar4 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar3->bind_info);
  local_100._0_8_ = state_p[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)local_100);
  uVar2 = local_100._0_8_;
  this = (ArenaAllocator *)(local_100._0_8_ + 0xf0);
  ArenaAllocator::Reset(this);
  pvVar5 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  PVar1 = (pvVar5->type).physical_type_;
  pvVar5 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  if (PVar1 != (pvVar5->type).physical_type_) {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x10);
    local_100._0_8_ = local_100 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"Aggregate state combine type mismatch, expect %s, got %s","");
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    LogicalType::ToString_abi_cxx11_(&local_50,&pvVar5->type);
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
    LogicalType::ToString_abi_cxx11_(&local_70,&pvVar5->type);
    IOException::IOException<std::__cxx11::string,std::__cxx11::string>
              (pIVar6,(string *)local_100,&local_50,&local_70);
    __cxa_throw(pIVar6,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  pvVar5 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  Vector::ToUnifiedFormat(pvVar5,input->count,(UnifiedVectorFormat *)local_100);
  pvVar5 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  Vector::ToUnifiedFormat(pvVar5,input->count,&local_b8);
  if (input->count != 0) {
    pdVar8 = result->data + 8;
    idx = 0;
    do {
      iVar7 = idx;
      if (*(_func_int ***)local_100._0_8_ != (_func_int **)0x0) {
        iVar7 = (idx_t)*(uint *)((long)*(_func_int ***)local_100._0_8_ + idx * 4);
      }
      len = idx;
      if ((local_b8.sel)->sel_vector != (sel_t *)0x0) {
        len = (idx_t)(local_b8.sel)->sel_vector[idx];
      }
      puVar9 = (uint *)(local_100._8_8_ + iVar7 * 0x10);
      puVar11 = (uint *)(local_b8.data + len * 0x10);
      if ((unsigned_long *)local_100._16_8_ == (unsigned_long *)0x0) {
LAB_01510521:
        if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[len >> 6] >>
             (len & 0x3f) & 1) != 0)) {
LAB_01510543:
          if ((((unsigned_long *)local_100._16_8_ != (unsigned_long *)0x0) &&
              ((*(ulong *)(local_100._16_8_ + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) == 0)) &&
             ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0 ||
              ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[len >> 6]
                >> (len & 0x3f) & 1) != 0)))) {
            if (*puVar11 < 0xd) {
              pVVar10 = (Vector *)(puVar11 + 1);
            }
            else {
              pVVar10 = *(Vector **)(puVar11 + 2);
            }
            sVar13 = StringVector::AddStringOrBlob
                               ((StringVector *)result,pVVar10,
                                (char *)pFVar4[0x27]._vptr_FunctionData,len);
            *(long *)(pdVar8 + -8) = sVar13.value._0_8_;
            *(long *)pdVar8 = sVar13.value._8_8_;
            goto LAB_015106a9;
          }
          __n = pFVar4[0x27]._vptr_FunctionData;
          if ((__n != (_func_int **)(ulong)*puVar9) || (__n != (_func_int **)(ulong)*puVar11)) {
            pIVar6 = (IOException *)__cxa_allocate_exception(0x10);
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_120,
                       "Aggregate state size mismatch, expect %llu, got %llu and %llu","");
            IOException::IOException<unsigned_long,unsigned_long,unsigned_long>
                      (pIVar6,&local_120,(unsigned_long)pFVar4[0x27]._vptr_FunctionData,
                       (ulong)*puVar9,(ulong)*puVar11);
            __cxa_throw(pIVar6,&IOException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (*puVar9 < 0xd) {
            puVar9 = puVar9 + 1;
          }
          else {
            puVar9 = *(uint **)(puVar9 + 2);
          }
          switchD_01602a8a::default
                    (((FunctionLocalState *)(uVar2 + 0x10))->_vptr_FunctionLocalState,puVar9,
                     (size_t)__n);
          if (*puVar11 < 0xd) {
            puVar11 = puVar11 + 1;
          }
          else {
            puVar11 = *(uint **)(puVar11 + 2);
          }
          switchD_01602a8a::default
                    (((FunctionLocalState *)(uVar2 + 0x18))->_vptr_FunctionLocalState,puVar11,
                     (size_t)pFVar4[0x27]._vptr_FunctionData);
          local_120._M_dataplus._M_p = (pointer)0x0;
          local_120.field_2._M_local_buf[0] = '\x02';
          iVar7 = 1;
          local_120._M_string_length = (size_type)this;
          (*(code *)pFVar4[0x1a]._vptr_FunctionData)
                    ((FunctionLocalState *)(uVar2 + 0x20),(FunctionLocalState *)(uVar2 + 0x88),
                     &local_120);
          aVar12.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::AddStringOrBlob
                         ((StringVector *)result,
                          (Vector *)((FunctionLocalState *)(uVar2 + 0x18))->_vptr_FunctionLocalState
                          ,(char *)pFVar4[0x27]._vptr_FunctionData,iVar7);
        }
        else {
          if (*puVar9 < 0xd) {
            pVVar10 = (Vector *)(puVar9 + 1);
          }
          else {
            pVVar10 = *(Vector **)(puVar9 + 2);
          }
          aVar12.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::AddStringOrBlob
                         ((StringVector *)result,pVVar10,(char *)pFVar4[0x27]._vptr_FunctionData,len
                         );
        }
        *(long *)(pdVar8 + -8) = aVar12._0_8_;
        *(char **)pdVar8 = aVar12.pointer.ptr;
      }
      else {
        if ((((*(ulong *)(local_100._16_8_ + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) != 0) ||
            (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0)) ||
           ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[len >> 6] >>
             (len & 0x3f) & 1) != 0)) {
          if (((unsigned_long *)local_100._16_8_ == (unsigned_long *)0x0) ||
             ((*(ulong *)(local_100._16_8_ + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) != 0))
          goto LAB_01510521;
          goto LAB_01510543;
        }
        FlatVector::SetNull(result,idx,true);
      }
LAB_015106a9:
      idx = idx + 1;
      pdVar8 = pdVar8 + 0x10;
    } while (idx < input->count);
  }
  if (local_b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
  }
  if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
  }
  return;
}

Assistant:

static void AggregateStateCombine(DataChunk &input, ExpressionState &state_p, Vector &result) {
	auto &bind_data = ExportAggregateBindData::GetFrom(state_p);
	auto &local_state = ExecuteFunctionState::GetFunctionState(state_p)->Cast<CombineState>();
	local_state.allocator.Reset();

	D_ASSERT(bind_data.state_size == bind_data.aggr.state_size(bind_data.aggr));

	D_ASSERT(input.data.size() == 2);
	D_ASSERT(input.data[0].GetType().id() == LogicalTypeId::AGGREGATE_STATE);
	D_ASSERT(input.data[0].GetType() == result.GetType());

	if (input.data[0].GetType().InternalType() != input.data[1].GetType().InternalType()) {
		throw IOException("Aggregate state combine type mismatch, expect %s, got %s",
		                  input.data[0].GetType().ToString(), input.data[1].GetType().ToString());
	}

	UnifiedVectorFormat state0_data, state1_data;
	input.data[0].ToUnifiedFormat(input.size(), state0_data);
	input.data[1].ToUnifiedFormat(input.size(), state1_data);

	auto result_ptr = FlatVector::GetData<string_t>(result);

	for (idx_t i = 0; i < input.size(); i++) {
		auto state0_idx = state0_data.sel->get_index(i);
		auto state1_idx = state1_data.sel->get_index(i);

		auto &state0 = UnifiedVectorFormat::GetData<string_t>(state0_data)[state0_idx];
		auto &state1 = UnifiedVectorFormat::GetData<string_t>(state1_data)[state1_idx];

		// if both are NULL, we return NULL. If either of them is not, the result is that one
		if (!state0_data.validity.RowIsValid(state0_idx) && !state1_data.validity.RowIsValid(state1_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}
		if (state0_data.validity.RowIsValid(state0_idx) && !state1_data.validity.RowIsValid(state1_idx)) {
			result_ptr[i] =
			    StringVector::AddStringOrBlob(result, const_char_ptr_cast(state0.GetData()), bind_data.state_size);
			continue;
		}
		if (!state0_data.validity.RowIsValid(state0_idx) && state1_data.validity.RowIsValid(state1_idx)) {
			result_ptr[i] =
			    StringVector::AddStringOrBlob(result, const_char_ptr_cast(state1.GetData()), bind_data.state_size);
			continue;
		}

		// we actually have to combine
		if (state0.GetSize() != bind_data.state_size || state1.GetSize() != bind_data.state_size) {
			throw IOException("Aggregate state size mismatch, expect %llu, got %llu and %llu", bind_data.state_size,
			                  state0.GetSize(), state1.GetSize());
		}

		memcpy(local_state.state_buffer0.get(), state0.GetData(), bind_data.state_size);
		memcpy(local_state.state_buffer1.get(), state1.GetData(), bind_data.state_size);

		AggregateInputData aggr_input_data(nullptr, local_state.allocator, AggregateCombineType::ALLOW_DESTRUCTIVE);
		bind_data.aggr.combine(local_state.state_vector0, local_state.state_vector1, aggr_input_data, 1);

		result_ptr[i] = StringVector::AddStringOrBlob(result, const_char_ptr_cast(local_state.state_buffer1.get()),
		                                              bind_data.state_size);
	}
}